

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_get_bitstring_null(uchar **p,uchar *end,size_t *len)

{
  ulong uVar1;
  uchar *puVar2;
  int iVar3;
  
  iVar3 = mbedtls_asn1_get_tag(p,end,len,3);
  if (iVar3 == 0) {
    uVar1 = *len;
    *len = uVar1 - 1;
    if (uVar1 < 2) {
      iVar3 = -0x68;
    }
    else {
      puVar2 = *p;
      *p = puVar2 + 1;
      iVar3 = -0x68;
      if (*puVar2 == '\0') {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_get_bitstring_null( unsigned char **p, const unsigned char *end,
                             size_t *len )
{
    int ret;

    if( ( ret = mbedtls_asn1_get_tag( p, end, len, MBEDTLS_ASN1_BIT_STRING ) ) != 0 )
        return( ret );

    if( (*len)-- < 2 || *(*p)++ != 0 )
        return( MBEDTLS_ERR_ASN1_INVALID_DATA );

    return( 0 );
}